

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O1

void __thiscall Basis::deactivate(Basis *this,HighsInt conid)

{
  iterator __position;
  mapped_type *pmVar1;
  int local_14;
  
  local_14 = conid;
  pmVar1 = std::
           map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
           ::operator[](&this->basisstatus,&local_14);
  *pmVar1 = kInactiveInBasis;
  remove<int>(&this->active_constraint_index,&local_14);
  __position._M_current =
       (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->non_active_constraint_index,__position,
               &local_14);
  }
  else {
    *__position._M_current = local_14;
    (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void Basis::deactivate(HighsInt conid) {
  // printf("deact %" HIGHSINT_FORMAT "\n", conid);
  assert(contains(active_constraint_index, conid));
  basisstatus[conid] = BasisStatus::kInactiveInBasis;
  remove(active_constraint_index, conid);
  non_active_constraint_index.push_back(conid);
}